

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O3

int try_preparse_cmd(voccxdef *ctx,char **cmd,int wrdcnt,uchar **preparse_list)

{
  uchar uVar1;
  ushort uVar2;
  char *__s;
  uint16_t tmp;
  size_t __n;
  ulong uVar3;
  runsdef *prVar4;
  undefined1 *puVar5;
  runsdef val;
  errdef fr_;
  uchar listbuf [514];
  runsdef local_380;
  errdef local_370;
  short local_238;
  undefined1 local_236 [518];
  
  if (ctx->voccxppc == 0xffff) {
    local_370.errcode = 0;
  }
  else {
    puVar5 = local_236;
    if (0 < wrdcnt) {
      uVar3 = 0;
      do {
        __s = cmd[uVar3];
        if (*__s == '\"') {
          uVar2 = *(ushort *)(__s + 1);
          *puVar5 = 3;
          *(ushort *)(puVar5 + 1) = uVar2 + 2;
          puVar5[3] = 0x22;
          memcpy(puVar5 + 4,__s + 3,(ulong)uVar2 - 2);
          puVar5 = puVar5 + uVar2;
          puVar5[2] = 0x22;
        }
        else {
          __n = strlen(__s);
          *puVar5 = 3;
          *(short *)(puVar5 + 1) = (short)__n + 2;
          memcpy(puVar5 + 3,__s,__n);
          puVar5 = puVar5 + __n;
        }
        puVar5 = puVar5 + 3;
        uVar3 = uVar3 + 1;
      } while ((uint)wrdcnt != uVar3);
    }
    local_380.runsv.runsvstr = (uchar *)&local_238;
    local_238 = (short)puVar5 - local_380.runsv.runsvobj;
    local_380.runstyp = '\a';
    runpush(ctx->voccxrun,7,&local_380);
    local_370.errcode = _setjmp((__jmp_buf_tag *)local_370.errbuf);
    if (local_370.errcode == 0) {
      local_370.errprv = ctx->voccxerr->errcxptr;
      ctx->voccxerr->errcxptr = &local_370;
      runfn(ctx->voccxrun,ctx->voccxppc,1);
      ctx->voccxerr->errcxptr = local_370.errprv;
      prVar4 = ctx->voccxrun->runcxsp;
      uVar1 = prVar4[-1].runstyp;
      prVar4 = prVar4 + -1;
      ctx->voccxrun->runcxsp = prVar4;
      if (uVar1 == '\a') {
        if (prVar4->runstyp != '\a') {
          ctx->voccxrun->runcxerr->errcxptr->erraac = 0;
          runsign(ctx->voccxrun,0x3fc);
        }
        *preparse_list = (uchar *)ctx->voccxrun->runcxsp->runsv;
        local_370.errcode = 30000;
      }
      else {
        local_370.errcode = 0x7531;
        if (uVar1 != '\x05') {
          local_370.errcode = 0;
        }
      }
    }
    else {
      ctx->voccxerr->errcxptr = local_370.errprv;
      if ((1 < local_370.errcode - 0x3f5U) && (local_370.errcode != 0x3fb)) {
        errrse1(ctx->voccxerr,&local_370);
      }
    }
  }
  return local_370.errcode;
}

Assistant:

int try_preparse_cmd(voccxdef *ctx, char **cmd, int wrdcnt,
                     uchar **preparse_list)
{
    uchar    listbuf[VOCBUFSIZ + 2 + 3*VOCBUFSIZ];
    int      i;
    uchar   *p;
    size_t   len;
    runsdef  val;
    int      typ;
    int      err;

    /* if there's no preparseCmd, keep processing */
    if (ctx->voccxppc == MCMONINV)
        return 0;
    
    /* build a list of the words */
    for (p = listbuf + 2, i = 0 ; i < wrdcnt ; ++i)
    {
        char *src;
        int add_quote;
        
        /* check for strings - they require special handling */
        if (cmd[i][0] == '"')
        {
            /* 
             *   it's a string - what follows is a run-time style string,
             *   with a length prefix followed by the text of the string 
             */
            len = osrp2(cmd[i] + 1) - 2;
            src = cmd[i] + 3;

            /* add quotes to the result */
            add_quote = TRUE;
        }
        else
        {
            /* ordinary word - copy directly */
            src = (char *)cmd[i];

            /* it's a null-terminated string */
            len = strlen(src);

            /* don't add quotes to the result */
            add_quote = FALSE;
        }

        /* write the type prefix */
        *p++ = DAT_SSTRING;

        /* write the length prefix */
        oswp2(p, len + 2 + (add_quote ? 2 : 0));
        p += 2;

        /* add an open quote if necessary */
        if (add_quote)
            *p++ = '"';

        /* copy the text */
        memcpy(p, src, len);
        p += len;

        /* add the closing quote if necessary */
        if (add_quote)
            *p++ = '"';
    }
    
    /* set the length of the whole list */
    len = p - listbuf;
    oswp2(listbuf, len);
    
    /* push the list as the argument, and call the user's preparseCmd */
    val.runstyp = DAT_LIST;
    val.runsv.runsvstr = listbuf;
    runpush(ctx->voccxrun, DAT_LIST, &val);

    /* presume that no error will occur */
    err = 0;

    /* catch errors that occur within preparseCmd */
    ERRBEGIN(ctx->voccxerr)
    {
        /* call preparseCmd */
        runfn(ctx->voccxrun, ctx->voccxppc, 1);
    }
    ERRCATCH(ctx->voccxerr, err)
    {
        /* 
         *   if it's abort/exit/exitobj, just return it; for any other
         *   errors, just re-throw the same error 
         */
        switch(err)
        {
        case ERR_RUNABRT:
        case ERR_RUNEXIT:
        case ERR_RUNEXITOBJ:
            /* simply return these errors to the caller */
            break;

        default:
            /* re-throw anything else */
            errrse(ctx->voccxerr);
        }
    }
    ERREND(ctx->voccxerr);

    /* if an error occurred, return the error code */
    if (err != 0)
        return err;

    /* get the result */
    typ = runtostyp(ctx->voccxrun);
    
    /* if they returned a list, it's a new command to execute */
    if (typ == DAT_LIST)
    {
        /* get the list and give it to the caller */
        *preparse_list = runpoplst(ctx->voccxrun);
        
        /* 
         *   indicate that the command is to be reparsed with the new word
         *   list 
         */
        return ERR_PREPRSCMDREDO;
    }

    /* for any other type, we don't need the value, so discard it */
    rundisc(ctx->voccxrun);

    /* if the result is nil, don't process this command further */
    if (typ == DAT_NIL)
        return ERR_PREPRSCMDCAN;
    else
        return 0;
}